

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O1

Hacl_Streaming_Types_error_code
Hacl_Hash_SHA3_update(Hacl_Hash_SHA3_state_t *state,uint8_t *chunk,uint32_t chunk_len)

{
  undefined1 *puVar1;
  Spec_Hash_Definitions_hash_alg a;
  Spec_Hash_Definitions_hash_alg SVar2;
  undefined4 uVar3;
  uint64_t *puVar4;
  undefined8 uVar5;
  undefined7 uVar6;
  Hacl_Streaming_Types_error_code HVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint64_t uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint8_t *blocks;
  uint64_t *s2;
  undefined1 local_75;
  undefined3 uStack_74;
  undefined1 auStack_57 [39];
  
  uVar15 = state->total_len;
  uVar14 = (ulong)chunk_len;
  HVar7 = '\x03';
  if (!CARRY8(uVar15,uVar14)) {
    a = (state->block_state).fst;
    uVar8 = block_len(a);
    uVar9 = block_len(a);
    if ((uVar15 == 0) || (uVar15 % (ulong)uVar8 != 0)) {
      uVar9 = (uint32_t)(uVar15 % (ulong)uVar9);
    }
    uVar8 = block_len(a);
    if (uVar8 - uVar9 < chunk_len) {
      puVar1 = &(state->block_state).field_0x1;
      if (uVar9 == 0) {
        SVar2 = (state->block_state).fst;
        uVar3 = *(undefined4 *)puVar1;
        uStack_74 = (undefined3)((uint)*(undefined4 *)&(state->block_state).field_0x4 >> 8);
        puVar4 = (state->block_state).snd;
        blocks = state->buf;
        uVar15 = state->total_len;
        uVar8 = block_len(a);
        uVar9 = block_len(a);
        if (((uVar15 != 0) && (uVar15 % (ulong)uVar8 == 0)) || (uVar15 % (ulong)uVar9 != 0)) {
          uVar8 = block_len(a);
          uVar9 = block_len(SVar2);
          Hacl_Hash_SHA3_update_multi_sha3(SVar2,puVar4,blocks,uVar8 / uVar9);
        }
        uVar8 = block_len(a);
        uVar9 = block_len(a);
        if (chunk_len % uVar8 != 0) {
          uVar9 = chunk_len % uVar9;
        }
        uVar8 = block_len(a);
        uVar10 = block_len(a);
        uVar11 = uVar10 * ((chunk_len - uVar9) / uVar8);
        uVar8 = block_len(SVar2);
        Hacl_Hash_SHA3_update_multi_sha3(SVar2,puVar4,chunk,uVar11 / uVar8);
        memcpy(blocks,chunk + uVar11,(ulong)(chunk_len - uVar11));
        uVar13 = uVar15 + uVar14;
        (state->block_state).fst = SVar2;
        local_75 = (undefined1)((uint)uVar3 >> 0x18);
        *(undefined4 *)puVar1 = uVar3;
        *(uint *)&(state->block_state).field_0x4 = CONCAT31(uStack_74,local_75);
        (state->block_state).snd = puVar4;
      }
      else {
        uVar8 = block_len(a);
        uVar14 = (ulong)(uVar8 - uVar9);
        uVar5 = *(undefined8 *)&state->block_state;
        puVar4 = (state->block_state).snd;
        blocks = state->buf;
        uVar15 = state->total_len;
        uVar10 = block_len(a);
        uVar11 = block_len(a);
        if ((uVar15 == 0) || (uVar15 % (ulong)uVar10 != 0)) {
          uVar11 = (uint)(uVar15 % (ulong)uVar11);
        }
        memcpy(blocks + uVar11,chunk,uVar14);
        uVar15 = uVar15 + uVar14;
        *(undefined8 *)&state->block_state = uVar5;
        (state->block_state).snd = puVar4;
        state->buf = blocks;
        state->total_len = uVar15;
        SVar2 = (state->block_state).fst;
        puVar4 = (state->block_state).snd;
        uVar10 = block_len(a);
        uVar12 = block_len(a);
        if (((uVar15 != 0) && (uVar15 % (ulong)uVar10 == 0)) || (uVar15 % (ulong)uVar12 != 0)) {
          uVar10 = block_len(a);
          uVar12 = block_len(SVar2);
          Hacl_Hash_SHA3_update_multi_sha3(SVar2,puVar4,blocks,uVar10 / uVar12);
        }
        uVar10 = block_len(a);
        uVar11 = chunk_len - (uVar8 - uVar9);
        uVar8 = block_len(a);
        if (uVar11 % uVar10 != 0 || uVar11 == 0) {
          uVar8 = uVar11 % uVar8;
        }
        uVar9 = block_len(a);
        uVar10 = block_len(a);
        uVar16 = uVar10 * ((uVar11 - uVar8) / uVar9);
        uVar8 = block_len(SVar2);
        Hacl_Hash_SHA3_update_multi_sha3(SVar2,puVar4,chunk + uVar14,uVar16 / uVar8);
        memcpy(blocks,chunk + uVar14 + uVar16,(ulong)(uVar11 - uVar16));
        uVar13 = uVar15 + uVar11;
        (state->block_state).fst = SVar2;
        auStack_57._0_4_ = (undefined4)((ulong)uVar5 >> 8);
        uVar3 = auStack_57._0_4_;
        auStack_57._3_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        *(undefined4 *)puVar1 = uVar3;
        *(undefined4 *)&(state->block_state).field_0x4 = auStack_57._3_4_;
        (state->block_state).snd = puVar4;
      }
    }
    else {
      SVar2 = (state->block_state).fst;
      uVar6 = *(undefined7 *)&(state->block_state).field_0x1;
      puVar4 = (state->block_state).snd;
      blocks = state->buf;
      uVar15 = state->total_len;
      uVar8 = block_len(a);
      uVar11 = block_len(a);
      if ((uVar15 == 0) || (uVar15 % (ulong)uVar8 != 0)) {
        uVar11 = (uint)(uVar15 % (ulong)uVar11);
      }
      memcpy(blocks + uVar11,chunk,uVar14);
      uVar13 = uVar15 + uVar14;
      (state->block_state).fst = SVar2;
      *(undefined7 *)&(state->block_state).field_0x1 = uVar6;
      (state->block_state).snd = puVar4;
    }
    state->buf = blocks;
    state->total_len = uVar13;
    HVar7 = '\0';
  }
  return HVar7;
}

Assistant:

Hacl_Streaming_Types_error_code
Hacl_Hash_SHA3_update(Hacl_Hash_SHA3_state_t *state, uint8_t *chunk, uint32_t chunk_len)
{
  Hacl_Hash_SHA3_state_t s = *state;
  Hacl_Hash_SHA3_hash_buf block_state = s.block_state;
  uint64_t total_len = s.total_len;
  Spec_Hash_Definitions_hash_alg i = block_state.fst;
  if ((uint64_t)chunk_len > 0xFFFFFFFFFFFFFFFFULL - total_len)
  {
    return Hacl_Streaming_Types_MaximumLengthExceeded;
  }
  uint32_t sz;
  if (total_len % (uint64_t)block_len(i) == 0ULL && total_len > 0ULL)
  {
    sz = block_len(i);
  }
  else
  {
    sz = (uint32_t)(total_len % (uint64_t)block_len(i));
  }
  if (chunk_len <= block_len(i) - sz)
  {
    Hacl_Hash_SHA3_state_t s1 = *state;
    Hacl_Hash_SHA3_hash_buf block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)block_len(i) == 0ULL && total_len1 > 0ULL)
    {
      sz1 = block_len(i);
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)block_len(i));
    }
    uint8_t *buf2 = buf + sz1;
    memcpy(buf2, chunk, chunk_len * sizeof (uint8_t));
    uint64_t total_len2 = total_len1 + (uint64_t)chunk_len;
    *state
    =
      ((Hacl_Hash_SHA3_state_t){ .block_state = block_state1, .buf = buf, .total_len = total_len2 });
  }
  else if (sz == 0U)
  {
    Hacl_Hash_SHA3_state_t s1 = *state;
    Hacl_Hash_SHA3_hash_buf block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)block_len(i) == 0ULL && total_len1 > 0ULL)
    {
      sz1 = block_len(i);
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)block_len(i));
    }
    if (!(sz1 == 0U))
    {
      Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
      uint64_t *s2 = block_state1.snd;
      Hacl_Hash_SHA3_update_multi_sha3(a1, s2, buf, block_len(i) / block_len(a1));
    }
    uint32_t ite;
    if ((uint64_t)chunk_len % (uint64_t)block_len(i) == 0ULL && (uint64_t)chunk_len > 0ULL)
    {
      ite = block_len(i);
    }
    else
    {
      ite = (uint32_t)((uint64_t)chunk_len % (uint64_t)block_len(i));
    }
    uint32_t n_blocks = (chunk_len - ite) / block_len(i);
    uint32_t data1_len = n_blocks * block_len(i);
    uint32_t data2_len = chunk_len - data1_len;
    uint8_t *data1 = chunk;
    uint8_t *data2 = chunk + data1_len;
    Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
    uint64_t *s2 = block_state1.snd;
    Hacl_Hash_SHA3_update_multi_sha3(a1, s2, data1, data1_len / block_len(a1));
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Hash_SHA3_state_t){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)chunk_len
        }
      );
  }
  else
  {
    uint32_t diff = block_len(i) - sz;
    uint8_t *chunk1 = chunk;
    uint8_t *chunk2 = chunk + diff;
    Hacl_Hash_SHA3_state_t s1 = *state;
    Hacl_Hash_SHA3_hash_buf block_state10 = s1.block_state;
    uint8_t *buf0 = s1.buf;
    uint64_t total_len10 = s1.total_len;
    uint32_t sz10;
    if (total_len10 % (uint64_t)block_len(i) == 0ULL && total_len10 > 0ULL)
    {
      sz10 = block_len(i);
    }
    else
    {
      sz10 = (uint32_t)(total_len10 % (uint64_t)block_len(i));
    }
    uint8_t *buf2 = buf0 + sz10;
    memcpy(buf2, chunk1, diff * sizeof (uint8_t));
    uint64_t total_len2 = total_len10 + (uint64_t)diff;
    *state
    =
      (
        (Hacl_Hash_SHA3_state_t){
          .block_state = block_state10,
          .buf = buf0,
          .total_len = total_len2
        }
      );
    Hacl_Hash_SHA3_state_t s10 = *state;
    Hacl_Hash_SHA3_hash_buf block_state1 = s10.block_state;
    uint8_t *buf = s10.buf;
    uint64_t total_len1 = s10.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)block_len(i) == 0ULL && total_len1 > 0ULL)
    {
      sz1 = block_len(i);
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)block_len(i));
    }
    if (!(sz1 == 0U))
    {
      Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
      uint64_t *s2 = block_state1.snd;
      Hacl_Hash_SHA3_update_multi_sha3(a1, s2, buf, block_len(i) / block_len(a1));
    }
    uint32_t ite;
    if
    (
      (uint64_t)(chunk_len - diff)
      % (uint64_t)block_len(i)
      == 0ULL
      && (uint64_t)(chunk_len - diff) > 0ULL
    )
    {
      ite = block_len(i);
    }
    else
    {
      ite = (uint32_t)((uint64_t)(chunk_len - diff) % (uint64_t)block_len(i));
    }
    uint32_t n_blocks = (chunk_len - diff - ite) / block_len(i);
    uint32_t data1_len = n_blocks * block_len(i);
    uint32_t data2_len = chunk_len - diff - data1_len;
    uint8_t *data1 = chunk2;
    uint8_t *data2 = chunk2 + data1_len;
    Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
    uint64_t *s2 = block_state1.snd;
    Hacl_Hash_SHA3_update_multi_sha3(a1, s2, data1, data1_len / block_len(a1));
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Hash_SHA3_state_t){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)(chunk_len - diff)
        }
      );
  }
  return Hacl_Streaming_Types_Success;
}